

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  bool bVar1;
  DeathTestOutcome DVar2;
  uint uVar3;
  Message *pMVar4;
  char *str;
  RE *pRVar5;
  ostream *poVar6;
  int exit_code;
  string local_160;
  GTestLog local_13c;
  string local_138;
  string local_118;
  string local_f8;
  char *local_d8;
  undefined1 local_c9;
  undefined1 local_c8 [7];
  bool matched;
  string local_a8;
  string local_88;
  char *local_68 [3];
  Message local_50;
  Message buffer;
  undefined1 local_40 [7];
  bool success;
  string error_message;
  bool status_ok_local;
  DeathTestImpl *this_local;
  
  error_message.field_2._M_local_buf[0xf] = status_ok;
  bVar1 = spawned(this);
  if (bVar1) {
    GetCapturedStderr_abi_cxx11_();
    buffer.ss_.ptr_._7_1_ = 0;
    Message::Message(&local_50);
    pMVar4 = Message::operator<<(&local_50,(char (*) [13])"Death test: ");
    local_68[0] = statement(this);
    pMVar4 = Message::operator<<(pMVar4,local_68);
    Message::operator<<(pMVar4,(char (*) [2])0x185318);
    DVar2 = outcome(this);
    switch(DVar2) {
    case IN_PROGRESS:
    default:
      GTestLog::GTestLog(&local_13c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/googletest/googletest/src/gtest-death-test.cc"
                         ,0x246);
      poVar6 = GTestLog::GetStream(&local_13c);
      std::operator<<(poVar6,"DeathTest::Passed somehow called before conclusion of test");
      GTestLog::~GTestLog(&local_13c);
      break;
    case DIED:
      if ((error_message.field_2._M_local_buf[0xf] & 1U) == 0) {
        pMVar4 = Message::operator<<(&local_50,
                                     (char (*) [51])
                                     "    Result: died but not with expected exit code:\n");
        pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"            ");
        uVar3 = status(this);
        ExitSummary_abi_cxx11_(&local_118,(internal *)(ulong)uVar3,exit_code);
        pMVar4 = Message::operator<<(pMVar4,&local_118);
        pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x185318);
        pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"Actual msg:\n");
        FormatDeathTestOutput(&local_138,(string *)local_40);
        Message::operator<<(pMVar4,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)&local_118);
      }
      else {
        str = (char *)std::__cxx11::string::c_str();
        pRVar5 = regex(this);
        local_c9 = RE::PartialMatch(str,pRVar5);
        if ((bool)local_c9) {
          buffer.ss_.ptr_._7_1_ = 1;
        }
        else {
          pMVar4 = Message::operator<<(&local_50,
                                       (char (*) [47])
                                       "    Result: died but not with expected error.\n");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [13])0x184b81);
          pRVar5 = regex(this);
          local_d8 = RE::pattern(pRVar5);
          pMVar4 = Message::operator<<(pMVar4,&local_d8);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x185318);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"Actual msg:\n");
          FormatDeathTestOutput(&local_f8,(string *)local_40);
          Message::operator<<(pMVar4,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
        }
      }
      break;
    case LIVED:
      pMVar4 = Message::operator<<(&local_50,(char (*) [28])"    Result: failed to die.\n");
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput(&local_88,(string *)local_40);
      Message::operator<<(pMVar4,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      break;
    case RETURNED:
      pMVar4 = Message::operator<<(&local_50,
                                   (char (*) [47])"    Result: illegal return in test statement.\n")
      ;
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput((string *)local_c8,(string *)local_40);
      Message::operator<<(pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_c8);
      std::__cxx11::string::~string((string *)local_c8);
      break;
    case THREW:
      pMVar4 = Message::operator<<(&local_50,(char (*) [33])"    Result: threw an exception.\n");
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput(&local_a8,(string *)local_40);
      Message::operator<<(pMVar4,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    Message::GetString_abi_cxx11_(&local_160,&local_50);
    DeathTest::set_last_death_test_message(&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    this_local._7_1_ = (bool)(buffer.ss_.ptr_._7_1_ & 1);
    Message::~Message(&local_50);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}